

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::evaluateCast
          (Type *type,ConstantValue *value,SourceRange sourceRange,EvalContext *context,
          bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ConstantValue *in_RDI;
  byte in_stack_00000008;
  const_iterator iter;
  uint64_t bitOffset;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  uint64_t targetWidth;
  uint64_t dynamicSize;
  uint64_t srcSize;
  ConstantValue *cv;
  uint64_t *in_stack_000001c8;
  uint64_t *in_stack_000001d0;
  PackIterator in_stack_000001d8;
  PackIterator *in_stack_000001e0;
  Type *in_stack_000001e8;
  nullptr_t in_stack_fffffffffffffed8;
  ConstantValue *in_stack_fffffffffffffee0;
  Type *in_stack_fffffffffffffee8;
  Diagnostic *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  EvalContext *in_stack_ffffffffffffff28;
  SourceLocation in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  DiagCode in_stack_ffffffffffffff44;
  SmallVectorBase<slang::ConstantValue_*> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  uVar2 = slang::ConstantValue::getBitstreamWidth((ConstantValue *)in_stack_ffffffffffffff88);
  if ((in_stack_00000008 & 1) == 0) {
    uVar3 = bitstreamCastRemainingSize<slang::ast::Type>
                      ((Type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                       (uint64_t)in_RDI);
    if (uVar2 < uVar3) {
      range.endLoc = in_stack_ffffffffffffff38;
      range.startLoc = in_stack_ffffffffffffff30;
      EvalContext::addDiag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff44,range);
      slang::ConstantValue::getBitstreamWidth((ConstantValue *)in_stack_ffffffffffffff88);
      Diagnostic::operator<<<unsigned_long>
                (in_stack_fffffffffffffef0,(unsigned_long)in_stack_fffffffffffffee8);
      ast::operator<<((Diagnostic *)in_stack_ffffffffffffff30,(Type *)in_stack_ffffffffffffff28);
      slang::ConstantValue::ConstantValue(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      return in_RDI;
    }
  }
  else {
    uVar3 = Type::getBitstreamWidth(in_stack_fffffffffffffee8);
    if ((uVar3 < uVar2) && (bVar1 = Type::isFixedSize((Type *)in_stack_ffffffffffffff28), bVar1)) {
      range_00.endLoc = in_stack_ffffffffffffff38;
      range_00.startLoc = in_stack_ffffffffffffff30;
      EvalContext::addDiag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff44,range_00);
      Diagnostic::operator<<<unsigned_long>
                (in_stack_fffffffffffffef0,(unsigned_long)in_stack_fffffffffffffee8);
      Diagnostic::operator<<<unsigned_long>
                (in_stack_fffffffffffffef0,(unsigned_long)in_stack_fffffffffffffee8);
      slang::ConstantValue::ConstantValue(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      return in_RDI;
    }
  }
  SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x11565fc);
  packBitstream((ConstantValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
  std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1156623);
  std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x1156650);
  unpackBitstream(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,
                  in_stack_000001c8);
  SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x11566c7);
  return in_RDI;
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.getBitstreamWidth();
    uint64_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.getBitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.getBitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    uint64_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    SLANG_ASSERT(!dynamicSize);
    SLANG_ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}